

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O3

void __thiscall
ctemplate::TemplateDictionary::DictionaryPrinter::
SortSections<std::map<std::__cxx11::string,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>const*>>>,ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>>
          (DictionaryPrinter *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>_>
          *sorted_section_dict,
          small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
          *section_dict)

{
  _Base_ptr p_Var1;
  uint uVar2;
  _Rb_tree_node_base *p_Var3;
  mapped_type *ppvVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  TemplateString key;
  key_type local_70;
  TemplateString local_50;
  
  uVar2 = section_dict->size_;
  p_Var5 = (_Rb_tree_node_base *)0x0;
  p_Var6 = (_Rb_tree_node_base *)&section_dict->field_2;
  if ((int)uVar2 < 0) {
    p_Var5 = *(_Rb_tree_node_base **)((long)&section_dict->field_2 + 0x20);
    p_Var6 = (_Rb_tree_node_base *)0x0;
  }
  while( true ) {
    if (p_Var6 == (_Rb_tree_node_base *)0x0) {
      if ((int)uVar2 < 0 && p_Var5 == (_Rb_tree_node_base *)((long)&section_dict->field_2 + 0x10)) {
        return;
      }
    }
    else {
      p_Var3 = (_Rb_tree_node_base *)0x0;
      if (-1 < (int)uVar2) {
        p_Var3 = (_Rb_tree_node_base *)((section_dict->field_2).array_ + uVar2);
      }
      if (p_Var6 == p_Var3) {
        return;
      }
    }
    p_Var3 = p_Var5 + 1;
    if (p_Var6 != (_Rb_tree_node_base *)0x0) {
      p_Var3 = p_Var6;
    }
    TemplateString::IdToString(&local_50,*(TemplateId *)p_Var3);
    if (local_50.ptr_ == (char *)0x0) break;
    p_Var1 = p_Var3->_M_parent;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,local_50.ptr_,local_50.ptr_ + local_50.length_);
    ppvVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>_>
              ::operator[](sorted_section_dict,&local_70);
    *ppvVar4 = (mapped_type)p_Var1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (p_Var6 == (_Rb_tree_node_base *)0x0) {
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      p_Var6 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var6 = (_Rb_tree_node_base *)&p_Var6->_M_left;
    }
    uVar2 = section_dict->size_;
  }
  __assert_fail("!InvalidTemplateString(key)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                ,0x325,
                "void ctemplate::TemplateDictionary::DictionaryPrinter::SortSections(MyMap *, const MySectionDict &) [MyMap = std::map<std::basic_string<char>, const std::vector<ctemplate::TemplateDictionary *, ctemplate::ArenaAllocator<ctemplate::TemplateDictionary *, ctemplate::UnsafeArena>> *>, MySectionDict = ctemplate::small_map<std::map<unsigned long, std::vector<ctemplate::TemplateDictionary *, ctemplate::ArenaAllocator<ctemplate::TemplateDictionary *, ctemplate::UnsafeArena>> *, std::less<unsigned long>, ctemplate::ArenaAllocator<std::pair<const unsigned long, std::vector<ctemplate::TemplateDictionary *, ctemplate::ArenaAllocator<ctemplate::TemplateDictionary *, ctemplate::UnsafeArena>> *>, ctemplate::UnsafeArena>>, 4, std::equal_to<unsigned long>, ctemplate::TemplateDictionary::map_arena_init>]"
               );
}

Assistant:

void SortSections(MyMap* sorted_section_dict,
                    const MySectionDict& section_dict) {
    typename MySectionDict::const_iterator it = section_dict.begin();
    for (; it != section_dict.end(); ++it) {
      const TemplateString key = TemplateDictionary::IdToString(it->first);
      assert(!InvalidTemplateString(key));  // checks key.ptr_ != NULL
      (*sorted_section_dict)[PrintableTemplateString(key)] = it->second;
    }
  }